

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

size_type __thiscall lf::mesh::hybrid2d::Mesh::Index(Mesh *this,Entity *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  uint __val;
  long lVar4;
  runtime_error *prVar5;
  pointer_____offset_0x10___ *ppuVar6;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar3 = (**e->_vptr_Entity)(e);
  if (iVar3 == 2) {
    ppuVar6 = &Point::typeinfo;
  }
  else if (iVar3 == 1) {
    ppuVar6 = &Segment::typeinfo;
  }
  else {
    if (iVar3 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      __val = (**e->_vptr_Entity)(e);
      std::__cxx11::to_string(&local_1e0,__val);
      std::operator+(&local_200,"Something is horribyl wrong, this entity has codim = ",&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,local_200._M_dataplus._M_p,local_200._M_string_length);
      paVar1 = &local_200.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_1e0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      local_200._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"false","");
      local_1e0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_200,&local_1e0,0x66,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = (*e->_vptr_Entity[4])(e);
    if ((char)iVar3 == '\x03') {
      ppuVar6 = &Triangle::typeinfo;
    }
    else {
      iVar3 = (*e->_vptr_Entity[4])(e);
      if ((char)iVar3 != '\x04') {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Illegal cell type",0x11);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"false","");
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_200,&local_1e0,0x5d,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppuVar6 = &Quadrilateral::typeinfo;
    }
  }
  lVar4 = __dynamic_cast(e,&Entity::typeinfo,ppuVar6,0);
  if (lVar4 != 0) {
    return *(size_type *)(lVar4 + 8);
  }
  __cxa_bad_cast();
}

Assistant:

Mesh::size_type Mesh::Index(const Entity &e) const {
  switch (e.Codim()) {
    case 0: {
      if (e.RefEl() == lf::base::RefEl::kTria()) {
        return dynamic_cast<const Triangle &>(e).index();
      }
      if (e.RefEl() == lf::base::RefEl::kQuad()) {
        return dynamic_cast<const Quadrilateral &>(e).index();
      }
      LF_VERIFY_MSG(false, "Illegal cell type");
    }
    case 1:
      return dynamic_cast<const Segment &>(e).index();
    case 2:
      return dynamic_cast<const Point &>(e).index();
    default:
      LF_VERIFY_MSG(false,
                    "Something is horribyl wrong, this entity has codim = " +
                        std::to_string(e.Codim()));
  }
}